

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_servergreet_resp(connectdata *conn,int pop3code,pop3state instate)

{
  SessionHandle *data_00;
  char *__s;
  size_t sVar1;
  char *pcVar2;
  size_t timestamplen;
  size_t i;
  size_t len;
  char *line;
  pop3_conn *pop3c;
  SessionHandle *data;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  __s = (data_00->state).buffer;
  sVar1 = strlen(__s);
  if (pop3code == 0x2b) {
    if ((3 < sVar1) && (__s[sVar1 - 2] == '>')) {
      for (timestamplen = 3; timestamplen < sVar1 - 2; timestamplen = timestamplen + 1) {
        if (__s[timestamplen] == '<') {
          sVar1 = (sVar1 - 1) - timestamplen;
          if (sVar1 != 0) {
            pcVar2 = (char *)(*Curl_ccalloc)(1,sVar1 + 1);
            (conn->proto).imapc.mailbox_uidvalidity = pcVar2;
            if ((conn->proto).imapc.mailbox_uidvalidity != (char *)0x0) {
              memcpy((conn->proto).imapc.mailbox_uidvalidity,__s + timestamplen,sVar1);
              (conn->proto).imapc.mailbox_uidvalidity[sVar1] = '\0';
              (conn->proto).pop3c.authtypes = (conn->proto).pop3c.authtypes | 2;
            }
          }
          break;
        }
      }
    }
    data._4_4_ = pop3_perform_capa(conn);
  }
  else {
    Curl_failf(data_00,"Got unexpected pop3-server response");
    data._4_4_ = CURLE_FTP_WEIRD_SERVER_REPLY;
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_servergreet_resp(struct connectdata *conn,
                                            int pop3code,
                                            pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *line = data->state.buffer;
  size_t len = strlen(line);
  size_t i;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Got unexpected pop3-server response");
    result = CURLE_FTP_WEIRD_SERVER_REPLY;
  }
  else {
    /* Does the server support APOP authentication? */
    if(len >= 4 && line[len - 2] == '>') {
      /* Look for the APOP timestamp */
      for(i = 3; i < len - 2; ++i) {
        if(line[i] == '<') {
          /* Calculate the length of the timestamp */
          size_t timestamplen = len - 1 - i;
          if(!timestamplen)
            break;

          /* Allocate some memory for the timestamp */
          pop3c->apoptimestamp = (char *)calloc(1, timestamplen + 1);

          if(!pop3c->apoptimestamp)
            break;

          /* Copy the timestamp */
          memcpy(pop3c->apoptimestamp, line + i, timestamplen);
          pop3c->apoptimestamp[timestamplen] = '\0';

          /* Store the APOP capability */
          pop3c->authtypes |= POP3_TYPE_APOP;
          break;
        }
      }
    }

    result = pop3_perform_capa(conn);
  }

  return result;
}